

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall TPZEqnArray<long_double>::BeginEquation(TPZEqnArray<long_double> *this,int eq)

{
  TPZStack<int,_100>::Push(&this->fEqNumber,eq);
  this->fNumEq = this->fNumEq + 1;
  return;
}

Assistant:

void TPZEqnArray<TVar>::BeginEquation(int eq) {
	fEqNumber.Push(eq);
	fNumEq++;
}